

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_edge_sse4.c
# Opt level: O2

void av1_highbd_upsample_intra_edge_sse4_1(uint16_t *p,int sz,int bd)

{
  short sVar1;
  short sVar2;
  undefined4 uVar3;
  undefined1 (*pauVar4) [16];
  int iVar5;
  undefined1 in_XMM0 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar10 [16];
  short sVar11;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  undefined1 in_XMM5 [16];
  undefined1 auVar12 [16];
  short sVar21;
  undefined1 in_XMM6 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  short sVar27;
  short sVar31;
  uint16_t uVar32;
  uint16_t uVar33;
  uint16_t uVar34;
  uint16_t uVar35;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  
  pauVar4 = (undefined1 (*) [16])(p + -2);
  p[-2] = p[-1];
  p[sz] = p[(long)sz + -1];
  iVar5 = sz + 1;
  auVar12 = lddqu(in_XMM5,*(undefined1 (*) [16])(p + -2));
  auVar6 = lddqu(in_XMM0,*(undefined1 (*) [16])(p + 6));
  auVar8 = lddqu(in_XMM1,*(undefined1 (*) [16])(p + 0xe));
  auVar22 = lddqu(in_XMM6,*(undefined1 (*) [16])(p + 0x16));
  auVar9 = ZEXT416((uint)~(-1 << ((byte)bd & 0x1f)));
  auVar9 = pshuflw(auVar9,auVar9,0);
  auVar10 = pmovsxbd(in_XMM3,0x8080808);
  for (; auVar7 = auVar6, 0 < iVar5; iVar5 = iVar5 + -8) {
    sVar27 = auVar12._6_2_;
    sVar13 = auVar12._2_2_;
    sVar31 = auVar12._8_2_;
    sVar15 = auVar12._4_2_;
    uVar32 = auVar12._10_2_;
    uVar33 = auVar12._12_2_;
    uVar34 = auVar12._14_2_;
    uVar35 = auVar7._0_2_;
    auVar29._0_2_ = sVar15 + sVar13;
    auVar29._2_2_ = sVar27 + sVar15;
    auVar29._4_2_ = sVar31 + sVar27;
    auVar29._6_2_ = uVar32 + sVar31;
    auVar29._8_2_ = uVar33 + uVar32;
    auVar29._10_2_ = uVar34 + uVar33;
    auVar29._12_2_ = uVar35 + uVar34;
    auVar29._14_2_ = auVar7._2_2_ + uVar35;
    uVar3 = CONCAT22(auVar29._6_2_,uVar33 + sVar27);
    auVar6._8_8_ = (undefined8)
                   (CONCAT64(CONCAT42(uVar3,auVar29._4_2_),CONCAT22(uVar32 + sVar15,uVar33 + sVar27)
                            ) >> 0x10);
    auVar6._6_2_ = auVar29._2_2_;
    auVar6._4_2_ = sVar31 + sVar13;
    auVar6._2_2_ = auVar29._0_2_;
    auVar6._0_2_ = sVar27 + auVar12._0_2_;
    auVar28._2_2_ = auVar29._8_2_;
    auVar28._0_2_ = uVar34 + sVar31;
    auVar28._4_2_ = uVar35 + uVar32;
    auVar28._6_2_ = auVar29._10_2_;
    auVar28._8_2_ = auVar7._2_2_ + uVar33;
    auVar28._10_2_ = auVar29._12_2_;
    auVar28._12_2_ = auVar7._4_2_ + uVar34;
    auVar28._14_2_ = auVar29._14_2_;
    auVar23 = lddqu(auVar29,(undefined1  [16])av1_highbd_upsample_intra_edge_sse4_1::kernel[0]);
    auVar6 = pmaddwd(auVar6,auVar23);
    auVar29 = pmaddwd(auVar28,auVar23);
    auVar23._0_4_ = auVar6._0_4_ + auVar10._0_4_ >> 4;
    auVar23._4_4_ = auVar6._4_4_ + auVar10._4_4_ >> 4;
    auVar23._8_4_ = auVar6._8_4_ + auVar10._8_4_ >> 4;
    auVar23._12_4_ = auVar6._12_4_ + auVar10._12_4_ >> 4;
    auVar30._0_4_ = auVar29._0_4_ + auVar10._0_4_ >> 4;
    auVar30._4_4_ = auVar29._4_4_ + auVar10._4_4_ >> 4;
    auVar30._8_4_ = auVar29._8_4_ + auVar10._8_4_ >> 4;
    auVar30._12_4_ = auVar29._12_4_ + auVar10._12_4_ >> 4;
    auVar6 = packusdw(auVar23,auVar30);
    sVar1 = auVar9._0_2_;
    sVar11 = auVar6._0_2_;
    sVar2 = auVar9._2_2_;
    sVar14 = auVar6._2_2_;
    sVar16 = auVar6._4_2_;
    sVar17 = auVar6._6_2_;
    sVar18 = auVar6._8_2_;
    sVar19 = auVar6._10_2_;
    sVar20 = auVar6._12_2_;
    sVar21 = auVar6._14_2_;
    auVar26._0_12_ = auVar12._2_12_;
    auVar26._12_2_ = sVar31;
    auVar26._14_2_ = (ushort)(sVar2 < sVar17) * sVar2 | (ushort)(sVar2 >= sVar17) * sVar17;
    auVar25._12_4_ = auVar26._12_4_;
    auVar25._0_10_ = auVar12._2_10_;
    auVar25._10_2_ = (ushort)(sVar1 < sVar16) * sVar1 | (ushort)(sVar1 >= sVar16) * sVar16;
    auVar24._10_6_ = auVar25._10_6_;
    auVar24._0_8_ = auVar12._2_8_;
    auVar24._8_2_ = sVar27;
    auVar12._8_8_ = auVar24._8_8_;
    auVar12._6_2_ = (ushort)(sVar2 < sVar14) * sVar2 | (ushort)(sVar2 >= sVar14) * sVar14;
    auVar12._4_2_ = sVar15;
    auVar12._2_2_ = (ushort)(sVar1 < sVar11) * sVar1 | (ushort)(sVar1 >= sVar11) * sVar11;
    auVar12._0_2_ = sVar13;
    *pauVar4 = auVar12;
    *(uint16_t *)pauVar4[1] = uVar32;
    *(ushort *)((long)pauVar4[1] + 2) =
         (ushort)(sVar1 < sVar18) * sVar1 | (ushort)(sVar1 >= sVar18) * sVar18;
    *(uint16_t *)((long)pauVar4[1] + 4) = uVar33;
    *(ushort *)((long)pauVar4[1] + 6) =
         (ushort)(sVar2 < sVar19) * sVar2 | (ushort)(sVar2 >= sVar19) * sVar19;
    *(uint16_t *)((long)pauVar4[1] + 8) = uVar34;
    *(ushort *)((long)pauVar4[1] + 10) =
         (ushort)(sVar1 < sVar20) * sVar1 | (ushort)(sVar1 >= sVar20) * sVar20;
    *(uint16_t *)((long)pauVar4[1] + 0xc) = uVar35;
    *(ushort *)((long)pauVar4[1] + 0xe) =
         (ushort)(sVar2 < sVar21) * sVar2 | (ushort)(sVar2 >= sVar21) * sVar21;
    pauVar4 = pauVar4 + 2;
    auVar6 = auVar8;
    auVar8 = auVar22;
    auVar12 = auVar7;
    auVar22 = (undefined1  [16])0x0;
  }
  return;
}

Assistant:

void av1_highbd_upsample_intra_edge_sse4_1(uint16_t *p, int sz, int bd) {
  // interpolate half-sample positions
  assert(sz <= 24);

  DECLARE_ALIGNED(16, static const int16_t,
                  kernel[1][8]) = { { -1, 9, -1, 9, -1, 9, -1, 9 } };

  // Extend first/last samples (upper-left p[-1], last p[sz-1])
  // to support 4-tap filter
  p[-2] = p[-1];
  p[sz] = p[sz - 1];

  uint16_t *in = &p[-2];
  uint16_t *out = in;
  int n = sz + 1;

  __m128i in0 = _mm_lddqu_si128((__m128i *)&in[0]);
  __m128i in8 = _mm_lddqu_si128((__m128i *)&in[8]);
  __m128i in16 = _mm_lddqu_si128((__m128i *)&in[16]);
  __m128i in24 = _mm_lddqu_si128((__m128i *)&in[24]);

  while (n > 0) {
    __m128i in1 = _mm_alignr_epi8(in8, in0, 2);
    __m128i in2 = _mm_alignr_epi8(in8, in0, 4);
    __m128i in3 = _mm_alignr_epi8(in8, in0, 6);
    __m128i sum0 = _mm_add_epi16(in0, in3);
    __m128i sum1 = _mm_add_epi16(in1, in2);
    __m128i d0 = _mm_unpacklo_epi16(sum0, sum1);
    __m128i d1 = _mm_unpackhi_epi16(sum0, sum1);
    __m128i coef0 = _mm_lddqu_si128((__m128i *)kernel[0]);
    d0 = _mm_madd_epi16(d0, coef0);
    d1 = _mm_madd_epi16(d1, coef0);
    __m128i eight = _mm_set1_epi32(8);
    d0 = _mm_add_epi32(d0, eight);
    d1 = _mm_add_epi32(d1, eight);
    d0 = _mm_srai_epi32(d0, 4);
    d1 = _mm_srai_epi32(d1, 4);
    d0 = _mm_packus_epi32(d0, d1);
    __m128i max0 = _mm_set1_epi16((1 << bd) - 1);
    d0 = _mm_min_epi16(d0, max0);
    __m128i out0 = _mm_unpacklo_epi16(in1, d0);
    __m128i out1 = _mm_unpackhi_epi16(in1, d0);
    _mm_storeu_si128((__m128i *)&out[0], out0);
    _mm_storeu_si128((__m128i *)&out[8], out1);
    in0 = in8;
    in8 = in16;
    in16 = in24;
    in24 = _mm_setzero_si128();
    out += 16;
    n -= 8;
  }
}